

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O3

xmlAutomataStatePtr
xmlAutomataNewOnceTrans
          (xmlAutomataPtr am,xmlAutomataStatePtr from,xmlAutomataStatePtr to,xmlChar *token,int min,
          int max,void *data)

{
  xmlRegCounter *pxVar1;
  uint counter;
  int iVar2;
  xmlRegAtomPtr atom;
  xmlChar *pxVar3;
  
  if ((min <= max &&
       ((0 < min && token != (xmlChar *)0x0) &&
       (from != (xmlAutomataStatePtr)0x0 && am != (xmlAutomataPtr)0x0))) &&
     (atom = xmlRegNewAtom(am,XML_REGEXP_STRING), atom != (xmlRegAtomPtr)0x0)) {
    pxVar3 = xmlStrdup(token);
    atom->valuep = pxVar3;
    atom->data = data;
    atom->quant = XML_REGEXP_QUANT_ONCEONLY;
    atom->min = min;
    atom->max = max;
    counter = xmlRegGetCounter(am);
    if ((-1 < (int)counter) &&
       ((pxVar1 = am->counters, pxVar1[counter].min = 1, pxVar1[counter].max = 1,
        to != (xmlAutomataStatePtr)0x0 || (to = xmlRegStatePush(am), to != (xmlRegStatePtr)0x0)))) {
      xmlRegStateAddTrans(am,from,atom,to,counter,-1);
      iVar2 = xmlRegAtomPush(am,atom);
      if (-1 < iVar2) {
        am->state = to;
        return to;
      }
    }
    xmlRegFreeAtom(atom);
  }
  return (xmlAutomataStatePtr)0x0;
}

Assistant:

xmlAutomataStatePtr
xmlAutomataNewOnceTrans(xmlAutomataPtr am, xmlAutomataStatePtr from,
			 xmlAutomataStatePtr to, const xmlChar *token,
			 int min, int max, void *data) {
    xmlRegAtomPtr atom;
    int counter;

    if ((am == NULL) || (from == NULL) || (token == NULL))
	return(NULL);
    if (min < 1)
	return(NULL);
    if (max < min)
	return(NULL);
    atom = xmlRegNewAtom(am, XML_REGEXP_STRING);
    if (atom == NULL)
	return(NULL);
    atom->valuep = xmlStrdup(token);
    atom->data = data;
    atom->quant = XML_REGEXP_QUANT_ONCEONLY;
    atom->min = min;
    atom->max = max;
    /*
     * associate a counter to the transition.
     */
    counter = xmlRegGetCounter(am);
    if (counter < 0)
        goto error;
    am->counters[counter].min = 1;
    am->counters[counter].max = 1;

    /* xmlFAGenerateTransitions(am, from, to, atom); */
    if (to == NULL) {
	to = xmlRegStatePush(am);
        if (to == NULL)
            goto error;
    }
    xmlRegStateAddTrans(am, from, atom, to, counter, -1);
    if (xmlRegAtomPush(am, atom) < 0)
        goto error;
    am->state = to;
    return(to);

error:
    xmlRegFreeAtom(atom);
    return(NULL);
}